

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O0

void __thiscall
TPZMatRed<long_double,_TPZFMatrix<long_double>_>::UGlobal
          (TPZMatRed<long_double,_TPZFMatrix<long_double>_> *this,TPZFMatrix<long_double> *U1,
          TPZFMatrix<long_double> *result)

{
  TPZMatrixSolver<long_double> *pTVar1;
  int64_t iVar2;
  long *in_RDX;
  TPZBaseMatrix *in_RSI;
  long in_RDI;
  int64_t r1;
  int64_t r;
  int64_t c;
  TPZFMatrix<long_double> K01U1;
  TPZFMatrix<long_double> u0;
  int64_t in_stack_fffffffffffffdd0;
  long lVar3;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined6 in_stack_fffffffffffffde0;
  undefined2 in_stack_fffffffffffffde6;
  longdouble *in_stack_fffffffffffffde8;
  long *plVar4;
  int64_t in_stack_fffffffffffffdf0;
  TPZFMatrix<long_double> *pTVar5;
  int64_t in_stack_fffffffffffffdf8;
  long lVar6;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined1 local_198 [16];
  undefined1 local_188 [24];
  long local_170;
  TPZFMatrix<long_double> *local_168;
  long local_160;
  longdouble local_158;
  undefined1 local_148 [4];
  int in_stack_fffffffffffffebc;
  longdouble in_stack_fffffffffffffec0;
  longdouble in_stack_fffffffffffffed0;
  TPZFMatrix<long_double> *in_stack_fffffffffffffee8;
  TPZFMatrix<long_double> *in_stack_fffffffffffffef0;
  TPZFMatrix<long_double> *in_stack_fffffffffffffef8;
  TPZFMatrix<long_double> *in_stack_ffffffffffffff00;
  TPZMatRed<long_double,_TPZFMatrix<long_double>_> *in_stack_ffffffffffffff10;
  longdouble local_a8 [9];
  long *local_18;
  TPZBaseMatrix *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x1e0));
  TPZBaseMatrix::Cols((TPZBaseMatrix *)(in_RDI + 0x1e0));
  TPZFMatrix<long_double>::TPZFMatrix
            ((TPZFMatrix<long_double> *)
             CONCAT26(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0),
             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),in_stack_fffffffffffffdd0
            );
  if ((*(byte *)(in_RDI + 0x311) & 1) == 0) {
    TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0xc0));
    TPZBaseMatrix::Cols(local_10);
    local_158 = (longdouble)0;
    TPZFMatrix<long_double>::TPZFMatrix
              ((TPZFMatrix<long_double> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    TPZFMatrix<long_double>::MultAdd
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffebc);
    DecomposeK00(in_stack_ffffffffffffff10);
    pTVar1 = TPZAutoPointer<TPZMatrixSolver<long_double>_>::operator->
                       ((TPZAutoPointer<TPZMatrixSolver<long_double>_> *)(in_RDI + 0x28));
    (*(pTVar1->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(pTVar1,local_148,local_a8,0)
    ;
    TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x14541d8);
  }
  else {
    if ((*(byte *)(in_RDI + 0x312) & 1) == 0) {
      DecomposeK00(in_stack_ffffffffffffff10);
      pTVar1 = TPZAutoPointer<TPZMatrixSolver<long_double>_>::operator->
                         ((TPZAutoPointer<TPZMatrixSolver<long_double>_> *)(in_RDI + 0x28));
      (*(pTVar1->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])
                (pTVar1,in_RDI + 0x1e0,in_RDI + 0x1e0,0);
      *(undefined1 *)(in_RDI + 0x312) = 1;
    }
    TPZFMatrix<long_double>::MultAdd
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffebc);
  }
  plVar4 = local_18;
  lVar6 = *(long *)(in_RDI + 0x300);
  lVar3 = *(long *)(in_RDI + 0x308);
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)(in_RDI + 0x1e0));
  (**(code **)(*plVar4 + 0x70))(plVar4,lVar6 + lVar3,iVar2);
  for (local_160 = 0; lVar6 = local_160,
      iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)(in_RDI + 0x1e0)), lVar6 < iVar2;
      local_160 = local_160 + 1) {
    local_170 = 0;
    for (local_168 = (TPZFMatrix<long_double> *)0x0; (long)local_168 < *(long *)(in_RDI + 0x300);
        local_168 = (TPZFMatrix<long_double> *)
                    ((long)&(local_168->super_TPZMatrix<long_double>).super_TPZBaseMatrix.
                            super_TPZSavable._vptr_TPZSavable + 1)) {
      plVar4 = local_18;
      pTVar5 = local_168;
      lVar6 = local_160;
      TPZFMatrix<long_double>::GetVal(local_a8,local_168,local_160,in_RDI);
      (**(code **)(*plVar4 + 0x118))(plVar4,pTVar5,lVar6,local_188);
    }
    for (; plVar4 = local_18, pTVar5 = local_168, lVar6 = local_170,
        (long)local_168 < *(long *)(in_RDI + 0x300) + *(long *)(in_RDI + 0x308);
        local_168 = (TPZFMatrix<long_double> *)
                    ((long)&(local_168->super_TPZMatrix<long_double>).super_TPZBaseMatrix.
                            super_TPZSavable._vptr_TPZSavable + 1)) {
      local_170 = local_170 + 1;
      lVar3 = local_160;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,lVar6,local_160);
      (**(code **)(*plVar4 + 0x118))(plVar4,pTVar5,lVar3,local_198);
    }
  }
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x145446c);
  return;
}

Assistant:

void TPZMatRed<TVar, TSideMatrix >::UGlobal(const TPZFMatrix<TVar> & U1, TPZFMatrix<TVar> & result)
{
	TPZFMatrix<TVar> u0( fF0.Rows() , fF0.Cols() );
	
	if(fK01IsComputed)
	{
		//[u0]=[A00^-1][F0]-[A00^-1][A01]
        //compute [F0]=[A00^-1][F0]
        if(!fF0IsComputed)
        {
            DecomposeK00();
            fSolver->Solve(fF0,fF0);
            fF0IsComputed = true;
        }
		//make [u0]=[F0]-[U1]
		fK01.MultAdd(U1,(fF0),u0,-1,1);
	} else {
        TPZFMatrix<TVar> K01U1(fK01.Rows(),U1.Cols(),0.);
        fK01.MultAdd(U1,fF0,K01U1,-1.,1.);
        DecomposeK00();
        fSolver->Solve(K01U1, u0);
	}
	
	//compute result
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
        U1.Print("U1 = ",sout,EMathematicaInput);
		fF0.Print("fF0 ",sout,EMathematicaInput);
		u0.Print("u0 " ,sout,EMathematicaInput);
		LOGPZ_DEBUG(logger,sout.str())   
		
	}
#endif
	
	result.Redim( fDim0+fDim1,fF0.Cols() );
	int64_t c,r,r1;
	
	for(c=0; c<fF0.Cols(); c++)
	{
		r1=0;
		for(r=0; r<fDim0; r++)
		{
			result.PutVal( r,c,u0.GetVal(r,c) ) ;
		}
		//aqui r=fDim0
		for( ;r<fDim0+fDim1; r++)
		{
			result.PutVal( r,c,U1.GetVal(r1++,c) );
		}
	}
}